

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

uint __thiscall
TArray<FDirectoryLump,_FDirectoryLump>::Reserve
          (TArray<FDirectoryLump,_FDirectoryLump> *this,uint amount)

{
  undefined8 *puVar1;
  uint uVar2;
  FDirectoryLump *pFVar3;
  long lVar4;
  ulong uVar5;
  
  Grow(this,amount);
  uVar2 = this->Count;
  uVar5 = (ulong)uVar2;
  this->Count = amount + uVar2;
  if (uVar2 < amount + uVar2) {
    lVar4 = uVar5 * 0x58;
    do {
      FString::NullString.RefCount = FString::NullString.RefCount + 2;
      pFVar3 = this->Array;
      *(undefined8 *)((long)&(pFVar3->super_FResourceLump).FullName.Chars + lVar4) = 0x8a502c;
      *(undefined2 *)(&(pFVar3->super_FResourceLump).Flags + lVar4) = 0;
      (pFVar3->super_FResourceLump).field_3.Name[lVar4] = '\0';
      puVar1 = (undefined8 *)((long)&(pFVar3->super_FResourceLump).Cache + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&(pFVar3->super_FResourceLump).Owner + lVar4 + 4);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined ***)((long)&(pFVar3->super_FResourceLump)._vptr_FResourceLump + lVar4) =
           &PTR__FDirectoryLump_0088bd08;
      *(undefined8 *)((long)&(pFVar3->mFullPath).Chars + lVar4) = 0x8a502c;
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x58;
    } while (uVar5 < this->Count);
  }
  return uVar2;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}